

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

reference __thiscall
andres::View<TestType,_true,_std::allocator<unsigned_long>_>::operator()
          (View<TestType,_true,_std::allocator<unsigned_long>_> *this,size_t value)

{
  reference pTVar1;
  runtime_error *this_00;
  size_t offset;
  size_t local_20;
  
  testInvariant(this);
  pTVar1 = this->data_;
  if (pTVar1 == (reference)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_0022f197:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->geometry_).dimension_ == 0) {
    if (value != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
      goto LAB_0022f197;
    }
  }
  else {
    indexToOffset(this,value,&local_20);
    pTVar1 = this->data_ + local_20;
  }
  return pTVar1;
}

Assistant:

inline typename View<T, isConst, A>::reference
View<T, isConst, A>::operator()
(
    const std::size_t value
) const
{
    testInvariant();    
    if(dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || value == 0);
        return data_[0];
    }
    else {
        std::size_t offset;
        indexToOffset(value, offset);
        return data_[offset];
    }
}